

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimBoundingBox(ON_Brep *this,ON_BrepTrim *trim,bool bLazy)

{
  bool bVar1;
  ON_Curve *pOVar2;
  bool local_51;
  ON_BoundingBox local_50;
  byte local_1a;
  byte local_19;
  bool rc;
  ON_BrepTrim *pOStack_18;
  bool bLazy_local;
  ON_BrepTrim *trim_local;
  ON_Brep *this_local;
  
  local_1a = 1;
  local_19 = bLazy;
  pOStack_18 = trim;
  trim_local = (ON_BrepTrim *)this;
  bVar1 = ON_BoundingBox::IsValid(&trim->m_pbox);
  if ((!bVar1) || ((local_19 & 1) == 0)) {
    ON_BoundingBox::Destroy(&pOStack_18->m_pbox);
    pOVar2 = ON_CurveProxy::ProxyCurve(&pOStack_18->super_ON_CurveProxy);
    if (pOVar2 != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_50,(ON_Geometry *)pOStack_18);
      memcpy(&pOStack_18->m_pbox,&local_50,0x30);
      (pOStack_18->m_pbox).m_min.z = 0.0;
      (pOStack_18->m_pbox).m_max.z = 0.0;
    }
  }
  local_51 = false;
  if ((local_1a & 1) != 0) {
    local_51 = ON_BoundingBox::IsValid(&pOStack_18->m_pbox);
  }
  return (bool)(-local_51 & 1);
}

Assistant:

bool ON_Brep::SetTrimBoundingBox( ON_BrepTrim& trim, bool bLazy )
{
  // TL_Brep overrides this function and computes much 
  // tighter bounding boxes that take trim.m_t[] into account.
  bool rc = true;
  if ( !trim.m_pbox.IsValid() || !bLazy )
  {
    trim.m_pbox.Destroy();
    if ( trim.ProxyCurve() )
    {
      trim.m_pbox = trim.BoundingBox();
      trim.m_pbox.m_min.z = 0.0;
      trim.m_pbox.m_max.z = 0.0;
    }
  }
  return (rc && trim.m_pbox.IsValid()) ? true : false;
}